

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O3

void __thiscall helics::MessageTimer::sendMessage(MessageTimer *this,int32_t timerIndex)

{
  pointer pAVar1;
  long lVar2;
  unique_lock<std::mutex> lock;
  ActionMessage buf;
  unique_lock<std::mutex> local_e0;
  ActionMessage local_d0;
  
  local_e0._M_device = &this->timerLock;
  local_e0._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_e0);
  local_e0._M_owns = true;
  if ((-1 < timerIndex) &&
     (timerIndex <
      (int)((ulong)((long)(this->timers).
                          super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->timers).
                         super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
    lVar2 = std::chrono::_V2::steady_clock::now();
    if ((this->expirationTimes).
        super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(uint)timerIndex].__d.__r <= lVar2) {
      pAVar1 = (this->buffers).
               super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pAVar1[(uint)timerIndex].messageAction != cmd_ignore) {
        ActionMessage::ActionMessage(&local_d0,pAVar1 + (uint)timerIndex);
        ActionMessage::setAction
                  ((this->buffers).
                   super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                   ._M_impl.super__Vector_impl_data._M_start + (uint)timerIndex,cmd_ignore);
        std::unique_lock<std::mutex>::unlock(&local_e0);
        if ((this->sendFunction).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->sendFunction)._M_invoker)((_Any_data *)&this->sendFunction,&local_d0);
        ActionMessage::~ActionMessage(&local_d0);
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_e0);
  return;
}

Assistant:

void MessageTimer::sendMessage(int32_t timerIndex)
{
    std::unique_lock<std::mutex> lock(timerLock);
    if ((timerIndex >= 0) && (timerIndex < static_cast<int32_t>(timers.size()))) {
        if (std::chrono::steady_clock::now() >= expirationTimes[timerIndex]) {
            if (buffers[timerIndex].action() != CMD_IGNORE) {
                ActionMessage buf = std::move(buffers[timerIndex]);
                buffers[timerIndex].setAction(CMD_IGNORE);  // clear out the action
                lock.unlock();  // don't keep a lock while calling a callback
                sendFunction(std::move(buf));
            }
        }
    }
}